

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O0

void MULTILABEL::output_example(vw *all,example *ec)

{
  byte bVar1;
  uint uVar2;
  shared_data *this;
  code *pcVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  int **ppiVar8;
  uint *puVar9;
  long in_RSI;
  undefined8 *in_RDI;
  example *in_stack_000000c0;
  bool in_stack_000000cf;
  vw *in_stack_000000d0;
  size_t i;
  stringstream ss;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  uint32_t given_index;
  uint32_t preds_index;
  labels given;
  labels preds;
  float loss;
  labels *ld;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  float local_294;
  float local_28c;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  string local_248 [48];
  ulong local_218;
  stringstream local_210 [16];
  ostream local_200;
  int local_84;
  int *local_80;
  int *local_78;
  v_array<int> *local_70;
  uint local_68;
  uint local_64;
  v_array<unsigned_int> local_60;
  v_array<unsigned_int> local_40;
  float local_1c;
  long local_18;
  long local_10;
  undefined8 *local_8;
  
  local_18 = in_RSI + 0x6828;
  local_1c = 0.0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar5 = test_label((void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  if (!bVar5) {
    local_40._begin = *(uint **)(local_10 + 0x6850);
    local_40._end = *(uint **)(local_10 + 0x6858);
    local_40.end_array = *(uint **)(local_10 + 0x6860);
    local_40.erase_count = *(size_t *)(local_10 + 0x6868);
    local_60._begin = *(uint **)(local_10 + 0x6828);
    local_60._end = *(uint **)(local_10 + 0x6830);
    local_60.end_array = *(uint **)(local_10 + 0x6838);
    local_60.erase_count = *(size_t *)(local_10 + 0x6840);
    local_64 = 0;
    local_68 = 0;
    while( true ) {
      uVar6 = (ulong)local_64;
      sVar7 = v_array<unsigned_int>::size(&local_40);
      bVar5 = false;
      if (uVar6 < sVar7) {
        uVar6 = (ulong)local_68;
        sVar7 = v_array<unsigned_int>::size(&local_60);
        bVar5 = uVar6 < sVar7;
      }
      if (!bVar5) break;
      puVar9 = v_array<unsigned_int>::operator[](&local_40,(ulong)local_64);
      uVar2 = *puVar9;
      puVar9 = v_array<unsigned_int>::operator[](&local_60,(ulong)local_68);
      if (uVar2 < *puVar9) {
        local_64 = local_64 + 1;
        local_1c = local_1c + 1.0;
      }
      else {
        puVar9 = v_array<unsigned_int>::operator[](&local_40,(ulong)local_64);
        uVar2 = *puVar9;
        puVar9 = v_array<unsigned_int>::operator[](&local_60,(ulong)local_68);
        if (*puVar9 < uVar2) {
          local_1c = local_1c + 1.0;
        }
        else {
          local_64 = local_64 + 1;
        }
        local_68 = local_68 + 1;
      }
    }
    sVar7 = v_array<unsigned_int>::size(&local_60);
    local_28c = (float)(sVar7 - local_68);
    local_1c = local_1c + local_28c;
    sVar7 = v_array<unsigned_int>::size(&local_40);
    local_294 = (float)(sVar7 - local_64);
    local_1c = local_294 + local_1c;
  }
  this = (shared_data *)*local_8;
  bVar1 = *(byte *)(local_10 + 0x68c8);
  bVar5 = test_label((void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  shared_data::update(this,(bool)(bVar1 & 1),(bool)((bVar5 ^ 0xffU) & 1),local_1c,1.0,
                      *(size_t *)(local_10 + 0x68a0));
  local_70 = (v_array<int> *)(local_8 + 0x6a2);
  ppiVar8 = v_array<int>::begin(local_70);
  local_78 = *ppiVar8;
  ppiVar8 = v_array<int>::end(local_70);
  local_80 = *ppiVar8;
  uStack_260 = in_stack_fffffffffffffd00;
  uStack_25c = in_stack_fffffffffffffd04;
  for (; local_78 != local_80; local_78 = local_78 + 1) {
    local_84 = *local_78;
    if (-1 < local_84) {
      std::__cxx11::stringstream::stringstream(local_210);
      for (local_218 = 0; uVar6 = local_218,
          sVar7 = v_array<unsigned_int>::size((v_array<unsigned_int> *)(local_10 + 0x6850)),
          uVar6 < sVar7; local_218 = local_218 + 1) {
        if (local_218 != 0) {
          std::operator<<(&local_200,',');
        }
        puVar9 = v_array<unsigned_int>::operator[]
                           ((v_array<unsigned_int> *)(local_10 + 0x6850),local_218);
        std::ostream::operator<<(&local_200,*puVar9);
      }
      std::operator<<(&local_200,' ');
      iVar4 = local_84;
      pcVar3 = (code *)local_8[0x6a8];
      std::__cxx11::stringstream::str();
      uStack_260 = (undefined4)*(undefined8 *)(local_10 + 0x6880);
      uStack_25c = (undefined4)((ulong)*(undefined8 *)(local_10 + 0x6880) >> 0x20);
      (*pcVar3)(iVar4,local_248);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::stringstream::~stringstream(local_210);
    }
  }
  test_label((void *)CONCAT44(uStack_25c,uStack_260));
  print_update(in_stack_000000d0,in_stack_000000cf,in_stack_000000c0);
  return;
}

Assistant:

void output_example(vw& all, example& ec)
{
  labels& ld = ec.l.multilabels;

  float loss = 0.;
  if (!test_label(&ld))
  {
    // need to compute exact loss
    labels preds = ec.pred.multilabels;
    labels given = ec.l.multilabels;

    uint32_t preds_index = 0;
    uint32_t given_index = 0;

    while (preds_index < preds.label_v.size() && given_index < given.label_v.size())
    {
      if (preds.label_v[preds_index] < given.label_v[given_index])
      {
        preds_index++;
        loss++;
      }
      else if (preds.label_v[preds_index] > given.label_v[given_index])
      {
        given_index++;
        loss++;
      }
      else
      {
        preds_index++;
        given_index++;
      }
    }
    loss += given.label_v.size() - given_index;
    loss += preds.label_v.size() - preds_index;
  }

  all.sd->update(ec.test_only, !test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (sink >= 0)
    {
      std::stringstream ss;

      for (size_t i = 0; i < ec.pred.multilabels.label_v.size(); i++)
      {
        if (i > 0)
          ss << ',';
        ss << ec.pred.multilabels.label_v[i];
      }
      ss << ' ';
      all.print_text(sink, ss.str(), ec.tag);
    }

  print_update(all, test_label(&ec.l.multilabels), ec);
}